

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O3

void ares_llist_node_destroy(ares_llist_node_t *node)

{
  void *pvVar1;
  ares_llist_destructor_t UNRECOVERED_JUMPTABLE;
  
  if (node != (ares_llist_node_t *)0x0) {
    pvVar1 = node->data;
    UNRECOVERED_JUMPTABLE = node->parent->destruct;
    ares_llist_node_detach(node);
    ares_free(node);
    if (UNRECOVERED_JUMPTABLE != (ares_llist_destructor_t)0x0 && pvVar1 != (void *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(pvVar1);
      return;
    }
  }
  return;
}

Assistant:

void ares_llist_node_destroy(ares_llist_node_t *node)
{
  ares_llist_destructor_t destruct;
  void                   *val;

  if (node == NULL) {
    return;
  }

  destruct = node->parent->destruct;

  val = ares_llist_node_claim(node);
  if (val != NULL && destruct != NULL) {
    destruct(val);
  }
}